

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::ParamSpec::MergePartialFromCodedStream(ParamSpec *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  float *pfVar4;
  ArenaStringPtr *pAVar5;
  bool bVar6;
  uint32 uVar7;
  int64 iVar8;
  UnknownFieldSet *pUVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  string *value;
  float fVar13;
  float local_40;
  float local_3c;
  ArenaStringPtr *local_38;
  
  this_00 = &this->_internal_metadata_;
  local_38 = &this->name_;
LAB_003ad380:
  do {
    pbVar2 = input->buffer_;
    uVar7 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar7 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ad3a3;
      input->buffer_ = pbVar2 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ad3a3:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar12 = 0;
      if (uVar7 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar7 | uVar12;
    }
    pAVar5 = local_38;
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) != 0) {
      cVar10 = (char)uVar12;
      switch((uint)(uVar12 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar10 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          value = (this->name_).ptr_;
          if (value == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
          {
            google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                      (local_38,(string *)
                                &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
            value = pAVar5->ptr_;
          }
          bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
          if (!bVar6) {
            return false;
          }
          google::protobuf::internal::WireFormatLite::VerifyUtf8String
                    ((local_38->ptr_->_M_dataplus)._M_p,(int)local_38->ptr_->_M_string_length,PARSE,
                     "caffe.ParamSpec.name");
          goto LAB_003ad380;
        }
        break;
      case 2:
        if (cVar10 == '\x10') {
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar7 = (uint32)bVar1;
            uVar11 = (uint)bVar1;
            if ((char)bVar1 < '\0') goto LAB_003ad543;
            input->buffer_ = pbVar2 + 1;
          }
          else {
            uVar7 = 0;
LAB_003ad543:
            iVar8 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
            uVar11 = (uint)iVar8;
            if (iVar8 < 0) {
              return false;
            }
          }
          if (uVar11 < 2) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->share_mode_ = uVar11;
          }
          else {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar9 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            google::protobuf::UnknownFieldSet::AddVarint(pUVar9,2,(long)(int)uVar11);
          }
          goto LAB_003ad380;
        }
        break;
      case 3:
        if (cVar10 == '\x1d') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_40);
            fVar13 = local_40;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->lr_mult_ = fVar13;
          goto LAB_003ad380;
        }
        break;
      case 4:
        if (cVar10 == '%') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar6 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)&local_3c);
            fVar13 = local_3c;
            if (!bVar6) {
              return false;
            }
          }
          else {
            fVar13 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->decay_mult_ = fVar13;
          goto LAB_003ad380;
        }
      }
    }
    if (uVar11 == 0) {
      return true;
    }
    if ((uVar11 & 7) == 4) {
      return true;
    }
    pvVar3 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar3 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
    }
    bVar6 = google::protobuf::internal::WireFormat::SkipField(input,uVar11,pUVar9);
    if (!bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool ParamSpec::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ParamSpec)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ParamSpec.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParamSpec.DimCheckMode share_mode = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::ParamSpec_DimCheckMode_IsValid(value)) {
            set_share_mode(static_cast< ::caffe::ParamSpec_DimCheckMode >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float lr_mult = 3 [default = 1];
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(29u)) {
          set_has_lr_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &lr_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float decay_mult = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(37u)) {
          set_has_decay_mult();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &decay_mult_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ParamSpec)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ParamSpec)
  return false;
#undef DO_
}